

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall llvm::yaml::Scanner::removeSimpleKeyCandidatesOnFlowLevel(Scanner *this,uint Level)

{
  ulong uVar1;
  
  uVar1 = (ulong)(this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
                 super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
                 super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
                 super_SmallVectorBase.Size;
  if ((uVar1 != 0) &&
     (*(uint *)((long)(this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
                      super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
                      super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
                      super_SmallVectorBase.BeginX + uVar1 * 0x18 + -8) == Level)) {
    if ((ulong)(this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
               super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
               super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
               super_SmallVectorBase.Capacity < uVar1 - 1) {
      __assert_fail("N <= capacity()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                    ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
    }
    (this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
    super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
    super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.super_SmallVectorBase.
    Size = (uint)(uVar1 - 1);
  }
  return;
}

Assistant:

LLVM_NODISCARD bool empty() const { return !Size; }